

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

void __thiscall OSSLRSA::~OSSLRSA(OSSLRSA *this)

{
  AsymmetricAlgorithm *in_RDI;
  
  in_RDI->_vptr_AsymmetricAlgorithm = (_func_int **)&PTR__OSSLRSA_00223268;
  if ((in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) &&
     (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0)) {
    (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
  }
  if ((in_RDI[1].currentPublicKey != (PublicKey *)0x0) &&
     (in_RDI[1].currentPublicKey != (PublicKey *)0x0)) {
    (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[1])();
  }
  AsymmetricAlgorithm::~AsymmetricAlgorithm(in_RDI);
  return;
}

Assistant:

OSSLRSA::~OSSLRSA()
{
	if (pCurrentHash != NULL)
	{
		delete pCurrentHash;
	}

	if (pSecondHash != NULL)
	{
		delete pSecondHash;
	}
}